

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode
SUNAdaptController_EstimateStep_Soderlind
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  int iVar1;
  double *in_RDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  sunrealtype hrat2;
  sunrealtype k3;
  sunrealtype hrat1;
  sunrealtype k2;
  sunrealtype k1;
  sunrealtype e1;
  int ord;
  SUNContext_conflict sunctx_local_scope_;
  
  iVar1 = in_ESI + 1;
  dVar2 = *(double *)(*in_RDI + 0x28) * in_XMM1_Qa;
  if (*(int *)(*in_RDI + 0x50) < *(int *)(*in_RDI + 0x54)) {
    dVar2 = pow(dVar2,-1.0 / (double)iVar1);
    *in_RDX = in_XMM0_Qa * dVar2;
  }
  else {
    dVar2 = pow(dVar2,-*(double *)*in_RDI / (double)iVar1);
    *in_RDX = in_XMM0_Qa * dVar2;
    if (0 < *(int *)(*in_RDI + 0x54)) {
      dVar2 = *(double *)(*in_RDI + 0x40);
      dVar3 = pow(*(double *)(*in_RDI + 0x30),-*(double *)(*in_RDI + 8) / (double)iVar1);
      dVar2 = pow(in_XMM0_Qa / dVar2,*(double *)(*in_RDI + 0x18));
      *in_RDX = dVar3 * dVar2 * *in_RDX;
      if (1 < *(int *)(*in_RDI + 0x54)) {
        dVar2 = *(double *)(*in_RDI + 0x40);
        dVar3 = *(double *)(*in_RDI + 0x48);
        dVar4 = pow(*(double *)(*in_RDI + 0x38),-*(double *)(*in_RDI + 0x10) / (double)iVar1);
        dVar2 = pow(dVar2 / dVar3,*(double *)(*in_RDI + 0x20));
        *in_RDX = dVar4 * dVar2 * *in_RDX;
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_Soderlind(SUNAdaptController C,
                                                     sunrealtype h, int p,
                                                     sunrealtype dsm,
                                                     sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);

  /* order parameter to use */
  const int ord        = p + 1;
  const sunrealtype e1 = SODERLIND_BIAS(C) * dsm;

  /* Handle the case of insufficient history */
  if (SODERLIND_FIRSTSTEPS(C) < SODERLIND_HISTORYSIZE(C))
  {
    /* Fall back onto an I controller */
    *hnew = h * SUNRpowerR(e1, -SUN_RCONST(1.0) / ord);
    return SUN_SUCCESS;
  }

  const sunrealtype k1 = -SODERLIND_K1(C) / ord;
  *hnew                = h * SUNRpowerR(e1, k1);

  /* This branching is not ideal, but it's more efficient than computing extra
   * math operations with degenerate k values. */
  /* TODO(SBR): Consider making separate subclasses for I and PI controllers for
   * improved efficiency */
  if (SODERLIND_HISTORYSIZE(C) > 0)
  {
    const sunrealtype k2    = -SODERLIND_K2(C) / ord;
    const sunrealtype hrat1 = h / SODERLIND_HP(C);
    *hnew *= SUNRpowerR(SODERLIND_EP(C), k2) * SUNRpowerR(hrat1, SODERLIND_K4(C));

    if (SODERLIND_HISTORYSIZE(C) > 1)
    {
      const sunrealtype k3    = -SODERLIND_K3(C) / ord;
      const sunrealtype hrat2 = SODERLIND_HP(C) / SODERLIND_HPP(C);
      *hnew *= SUNRpowerR(SODERLIND_EPP(C), k3) *
               SUNRpowerR(hrat2, SODERLIND_K5(C));
    }
  }

  /* return with success */
  return SUN_SUCCESS;
}